

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall Fl_Table::cols(Fl_Table *this,int val)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  
  this->_cols = val;
  uVar1 = (this->_colwidths)._size;
  lVar3 = (long)(int)uVar1;
  if (lVar3 == 0) {
    iVar4 = 0x50;
  }
  else {
    iVar4 = (this->_colwidths).arr[(int)(uVar1 - 1)];
  }
  if (uVar1 != val) {
    piVar2 = (int *)realloc((this->_colwidths).arr,(ulong)(uint)val << 2);
    (this->_colwidths).arr = piVar2;
    (this->_colwidths)._size = val;
  }
  if ((int)uVar1 < val) {
    piVar2 = (this->_colwidths).arr;
    do {
      piVar2[lVar3] = iVar4;
      lVar3 = lVar3 + 1;
    } while (val != lVar3);
  }
  table_resized(this);
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Table::cols(int val) {
  _cols = val;
  {
    int default_w = ( _colwidths.size() > 0 ) ? _colwidths[_colwidths.size()-1] : 80;
    int now_size = _colwidths.size();
    _colwidths.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _colwidths[now_size++] = default_w;	// fill new
    }
  }
  table_resized();
  redraw();
}